

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialAnalyzer.cpp
# Opt level: O2

void __thiscall
OpenMD::SequentialAnalyzer::SequentialAnalyzer
          (SequentialAnalyzer *this,SimInfo *info,string *filename,string *sele1,string *sele2)

{
  SelectionEvaluator *this_00;
  SelectionEvaluator *this_01;
  SelectionSet local_68 [2];
  string *local_38;
  
  this->_vptr_SequentialAnalyzer = (_func_int **)&PTR__SequentialAnalyzer_00221b10;
  this->info_ = info;
  this->currentSnapshot_ = (Snapshot *)0x0;
  local_38 = &this->dumpFilename_;
  std::__cxx11::string::string((string *)local_38,(string *)filename);
  SelectionManager::SelectionManager(&this->seleMan1_,info);
  std::__cxx11::string::string((string *)&this->selectionScript1_,(string *)sele1);
  this_00 = &this->evaluator1_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  SelectionManager::SelectionManager(&this->seleMan2_,info);
  std::__cxx11::string::string((string *)&this->selectionScript2_,(string *)sele2);
  this_01 = &this->evaluator2_;
  SelectionEvaluator::SelectionEvaluator(this_01,info);
  this->step_ = 1;
  (this->outputFilename_)._M_dataplus._M_p = (pointer)&(this->outputFilename_).field_2;
  (this->outputFilename_)._M_string_length = 0;
  (this->outputFilename_).field_2._M_local_buf[0] = '\0';
  (this->times_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->times_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->times_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sequenceType_)._M_dataplus._M_p = (pointer)&(this->sequenceType_).field_2;
  (this->sequenceType_)._M_string_length = 0;
  (this->sequenceType_).field_2._M_local_buf[0] = '\0';
  (this->paramString_)._M_dataplus._M_p = (pointer)&(this->paramString_).field_2;
  (this->paramString_).field_2._M_local_buf[0] = '\0';
  (this->paramString_)._M_string_length = 0;
  SelectionEvaluator::loadScriptString(this_00,&this->selectionScript1_);
  SelectionEvaluator::loadScriptString(this_01,&this->selectionScript2_);
  if ((this->evaluator1_).isDynamic_ == false) {
    SelectionEvaluator::evaluate(local_68,this_00);
    SelectionManager::setSelectionSet(&this->seleMan1_,local_68);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_68[0].bitsets_);
  }
  if ((this->evaluator2_).isDynamic_ == false) {
    SelectionEvaluator::evaluate(local_68,this_01);
    SelectionManager::setSelectionSet(&this->seleMan2_,local_68);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_68[0].bitsets_);
  }
  return;
}

Assistant:

SequentialAnalyzer::SequentialAnalyzer(SimInfo* info,
                                         const std::string& filename,
                                         const std::string& sele1,
                                         const std::string& sele2) :
      info_(info),
      currentSnapshot_(NULL), dumpFilename_(filename), seleMan1_(info),
      selectionScript1_(sele1), evaluator1_(info), seleMan2_(info),
      selectionScript2_(sele2), evaluator2_(info), step_(1) {
    paramString_.clear();

    evaluator1_.loadScriptString(selectionScript1_);
    evaluator2_.loadScriptString(selectionScript2_);

    // if selections are static, we only need to evaluate them once
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }
    if (!evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
    }
  }